

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

Constant * __thiscall soul::heart::Allocator::allocateZeroInitialiser(Allocator *this,Type *type)

{
  Constant *pCVar1;
  Type local_60;
  Value local_48;
  
  local_60.category = type->category;
  local_60.arrayElementCategory = type->arrayElementCategory;
  local_60.isRef = type->isRef;
  local_60.isConstant = type->isConstant;
  local_60.primitiveType.type = (type->primitiveType).type;
  local_60.boundingSize = type->boundingSize;
  local_60.arrayElementBoundingSize = type->arrayElementBoundingSize;
  local_60.structure.object = (type->structure).object;
  if (local_60.structure.object != (Structure *)0x0) {
    ((local_60.structure.object)->super_RefCountedObject).refCount =
         ((local_60.structure.object)->super_RefCountedObject).refCount + 1;
  }
  soul::Value::zeroInitialiser(&local_48,&local_60);
  pCVar1 = allocateConstant(this,&local_48);
  soul::Value::~Value(&local_48);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_60.structure.object);
  return pCVar1;
}

Assistant:

Constant& allocateZeroInitialiser (const Type& type)  { return allocateConstant (Value::zeroInitialiser (type)); }